

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86IntelInstPrinter.c
# Opt level: O1

void X86_Intel_printInst(MCInst *MI,SStream *O,void *Info)

{
  uint8_t *puVar1;
  char cVar2;
  cs_detail *pcVar3;
  _Bool _Var4;
  uint uVar5;
  x86_reg xVar6;
  MCOperand *pMVar7;
  int64_t iVar8;
  MCRegisterClass *c;
  MCRegisterInfo *extraout_RDX;
  MCRegisterInfo *extraout_RDX_00;
  MCRegisterInfo *extraout_RDX_01;
  MCRegisterInfo *extraout_RDX_02;
  MCRegisterInfo *extraout_RDX_03;
  MCRegisterInfo *extraout_RDX_04;
  MCRegisterInfo *extraout_RDX_05;
  MCRegisterInfo *extraout_RDX_06;
  MCRegisterInfo *extraout_RDX_07;
  MCRegisterInfo *extraout_RDX_08;
  MCRegisterInfo *extraout_RDX_09;
  MCRegisterInfo *extraout_RDX_10;
  MCRegisterInfo *extraout_RDX_11;
  MCRegisterInfo *extraout_RDX_12;
  MCRegisterInfo *extraout_RDX_13;
  MCRegisterInfo *pMVar9;
  MCRegisterInfo *extraout_RDX_14;
  char *pcVar10;
  char *pcVar11;
  x86_reg reg;
  x86_reg reg2;
  x86_reg local_40;
  x86_reg local_3c;
  char *local_38;
  
  uVar5 = MCInst_getOpcode(MI);
  pMVar9 = extraout_RDX;
  if ((int)uVar5 < 0x269) {
    if (uVar5 == 0x15) {
      uVar5 = MCInst_getNumOperands(MI);
      pMVar9 = extraout_RDX_04;
      if (uVar5 != 1) {
LAB_001a7c0d:
        pcVar10 = (char *)0x0;
        goto LAB_001a7c10;
      }
      pMVar7 = MCInst_getOperand(MI,0);
      _Var4 = MCOperand_isImm(pMVar7);
      pMVar9 = extraout_RDX_05;
      pcVar10 = (char *)0x0;
      if (!_Var4) goto LAB_001a7c10;
      pMVar7 = MCInst_getOperand(MI,0);
      iVar8 = MCOperand_getImm(pMVar7);
      pMVar9 = extraout_RDX_06;
      pcVar10 = (char *)0x0;
      if (iVar8 != 10) goto LAB_001a7c10;
      pcVar10 = "aad";
    }
    else {
      pcVar10 = (char *)0x0;
      if (uVar5 != 0x16) goto LAB_001a7c10;
      uVar5 = MCInst_getNumOperands(MI);
      pMVar9 = extraout_RDX_00;
      if (uVar5 != 1) goto LAB_001a7c0d;
      pMVar7 = MCInst_getOperand(MI,0);
      _Var4 = MCOperand_isImm(pMVar7);
      pMVar9 = extraout_RDX_01;
      pcVar10 = (char *)0x0;
      if (!_Var4) goto LAB_001a7c10;
      pMVar7 = MCInst_getOperand(MI,0);
      iVar8 = MCOperand_getImm(pMVar7);
      pMVar9 = extraout_RDX_02;
      pcVar10 = (char *)0x0;
      if (iVar8 != 10) goto LAB_001a7c10;
      pcVar10 = "aam";
    }
  }
  else if (uVar5 == 0x269) {
    uVar5 = MCInst_getNumOperands(MI);
    pMVar9 = extraout_RDX_07;
    if (uVar5 != 6) goto LAB_001a7c0d;
    pMVar7 = MCInst_getOperand(MI,0);
    _Var4 = MCOperand_isReg(pMVar7);
    pMVar9 = extraout_RDX_08;
    pcVar10 = (char *)0x0;
    if (!_Var4) goto LAB_001a7c10;
    c = MCRegisterInfo_getRegClass((MCRegisterInfo *)Info,0x2a);
    pMVar7 = MCInst_getOperand(MI,0);
    uVar5 = MCOperand_getReg(pMVar7);
    _Var4 = MCRegisterClass_contains(c,uVar5);
    pMVar9 = extraout_RDX_09;
    pcVar10 = (char *)0x0;
    if (!_Var4) goto LAB_001a7c10;
    pcVar10 = anon_var_dwarf_ed92b;
  }
  else {
    pcVar10 = (char *)0x0;
    if (uVar5 != 0x1879) goto LAB_001a7c10;
    uVar5 = MCInst_getNumOperands(MI);
    pMVar9 = extraout_RDX_03;
    if (uVar5 != 0) goto LAB_001a7c0d;
    pcVar10 = "xstorerng";
  }
  pcVar10 = cs_strdup(pcVar10);
  for (pcVar11 = pcVar10; cVar2 = *pcVar11, cVar2 != '\0'; pcVar11 = pcVar11 + 1) {
    if ((cVar2 == ' ') || (cVar2 == '\t')) {
      *pcVar11 = '\0';
      pcVar11 = pcVar11 + 1;
      break;
    }
  }
  SStream_concat0(O,pcVar10);
  pMVar9 = extraout_RDX_10;
  if (*pcVar11 != '\0') {
    local_38 = pcVar10;
    SStream_concat0(O,anon_var_dwarf_761af + 0x11);
    pMVar9 = extraout_RDX_11;
    do {
      cVar2 = *pcVar11;
      if (cVar2 == '$') {
        if (pcVar11[1] == -1) {
          pcVar10 = pcVar11 + 3;
          if (pcVar11[3] == '\x01') {
            cVar2 = pcVar11[2];
            SStream_concat0(O,"qword ptr ");
            MI->x86opsize = '\b';
            printMemReference(MI,(int)cVar2 - 1,O);
            pMVar9 = extraout_RDX_14;
          }
        }
        else {
          pcVar10 = pcVar11 + 1;
          printOperand(MI,(int)pcVar11[1] - 1,O);
          pMVar9 = extraout_RDX_13;
        }
      }
      else {
        pcVar10 = local_38;
        if (cVar2 == '\0') break;
        SStream_concat(O,"%c",(ulong)(uint)(int)cVar2);
        pMVar9 = extraout_RDX_12;
        pcVar10 = pcVar11;
      }
      pcVar11 = pcVar10 + 1;
    } while( true );
  }
LAB_001a7c10:
  if (pcVar10 == (char *)0x0) {
    printInstruction(MI,O,pMVar9);
  }
  else {
    (*cs_mem_free)(pcVar10);
  }
  uVar5 = MCInst_getOpcode(MI);
  xVar6 = X86_insn_reg_intel(uVar5);
  local_40 = xVar6;
  if (MI->csh->detail != CS_OPT_OFF) {
    if (xVar6 == X86_REG_INVALID) {
      uVar5 = MCInst_getOpcode(MI);
      _Var4 = X86_insn_reg_intel2(uVar5,&local_40,&local_3c);
      if (_Var4) {
        (MI->flat_insn->detail->field_6).x86.operands[0].type = X86_OP_REG;
        (MI->flat_insn->detail->field_6).x86.operands[0].field_1.reg = local_40;
        *(uint8_t *)((long)&MI->flat_insn->detail->field_6 + 0x50) = MI->csh->regsize_map[local_40];
        (MI->flat_insn->detail->field_6).x86.operands[1].type = X86_OP_REG;
        (MI->flat_insn->detail->field_6).x86.operands[1].field_1.reg = local_3c;
        *(uint8_t *)((long)&MI->flat_insn->detail->field_6 + 0x80) = MI->csh->regsize_map[local_3c];
        (MI->flat_insn->detail->field_6).x86.op_count = '\x02';
      }
    }
    else {
      pcVar3 = MI->flat_insn->detail;
      memmove((void *)((long)&pcVar3->field_6 + 0x60),(void *)((long)&pcVar3->field_6 + 0x30),0x150)
      ;
      (MI->flat_insn->detail->field_6).x86.operands[0].type = X86_OP_REG;
      (MI->flat_insn->detail->field_6).x86.operands[0].field_1.reg = xVar6;
      *(uint8_t *)((long)&MI->flat_insn->detail->field_6 + 0x50) = MI->csh->regsize_map[xVar6];
      *(uint8_t *)((long)&MI->flat_insn->detail->field_6 + 0x80) = MI->csh->regsize_map[xVar6];
      puVar1 = &(MI->flat_insn->detail->field_6).x86.op_count;
      *puVar1 = *puVar1 + '\x01';
    }
  }
  if (local_40 != X86_REG_INVALID && MI->op1_size == '\0') {
    MI->op1_size = MI->csh->regsize_map[local_40];
  }
  return;
}

Assistant:

void X86_Intel_printInst(MCInst *MI, SStream *O, void *Info)
{
	char *mnem;
	x86_reg reg, reg2;

	// Try to print any aliases first.
	mnem = printAliasInstr(MI, O, Info);
	if (mnem)
		cs_mem_free(mnem);
	else
		printInstruction(MI, O, Info);

	reg = X86_insn_reg_intel(MCInst_getOpcode(MI));
	if (MI->csh->detail) {
		// first op can be embedded in the asm by llvm.
		// so we have to add the missing register as the first operand
		if (reg) {
			// shift all the ops right to leave 1st slot for this new register op
			memmove(&(MI->flat_insn->detail->x86.operands[1]), &(MI->flat_insn->detail->x86.operands[0]),
					sizeof(MI->flat_insn->detail->x86.operands[0]) * (ARR_SIZE(MI->flat_insn->detail->x86.operands) - 1));
			MI->flat_insn->detail->x86.operands[0].type = X86_OP_REG;
			MI->flat_insn->detail->x86.operands[0].reg = reg;
			MI->flat_insn->detail->x86.operands[0].size = MI->csh->regsize_map[reg];
			MI->flat_insn->detail->x86.operands[1].size = MI->csh->regsize_map[reg];
			MI->flat_insn->detail->x86.op_count++;
		} else {
			if (X86_insn_reg_intel2(MCInst_getOpcode(MI), &reg, &reg2)) {
				MI->flat_insn->detail->x86.operands[0].type = X86_OP_REG;
				MI->flat_insn->detail->x86.operands[0].reg = reg;
				MI->flat_insn->detail->x86.operands[0].size = MI->csh->regsize_map[reg];
				MI->flat_insn->detail->x86.operands[1].type = X86_OP_REG;
				MI->flat_insn->detail->x86.operands[1].reg = reg2;
				MI->flat_insn->detail->x86.operands[1].size = MI->csh->regsize_map[reg2];
				MI->flat_insn->detail->x86.op_count = 2;
			}
		}
	}

	if (MI->op1_size == 0 && reg)
		MI->op1_size = MI->csh->regsize_map[reg];
}